

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O2

string * duckdb::CatalogSearchEntry::WriteOptionallyQuoted
                   (string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  uVar1 = 0;
  while( true ) {
    if (input->_M_string_length <= uVar1) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
      return __return_storage_ptr__;
    }
    if ((byte)((input->_M_dataplus)._M_p[uVar1] | 2U) == 0x2e) break;
    uVar1 = uVar1 + 1;
  }
  ::std::operator+(&bStack_38,"\"",input);
  ::std::operator+(__return_storage_ptr__,&bStack_38,"\"");
  ::std::__cxx11::string::~string((string *)&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchEntry::WriteOptionallyQuoted(const string &input) {
	for (idx_t i = 0; i < input.size(); i++) {
		if (input[i] == '.' || input[i] == ',') {
			return "\"" + input + "\"";
		}
	}
	return input;
}